

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effect3d.cpp
# Opt level: O0

int __thiscall
LREffect::draw(LREffect *this,Mat *image,vector<Object,_std::allocator<Object>_> *objects)

{
  ostream *poVar1;
  _InputOutputArray *p_Var2;
  size_type sVar3;
  reference pvVar4;
  vector<Object,_std::allocator<Object>_> *in_RDX;
  long in_RSI;
  int j;
  uchar *mp;
  int y;
  bool is_mask;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> points;
  Object *obj;
  size_t i;
  bool has_major_obj;
  int right_x;
  int left_x;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  Point_<int> *in_stack_fffffffffffffe38;
  _InputOutputArray *this_00;
  double in_stack_fffffffffffffe48;
  Scalar_<double> *in_stack_fffffffffffffe50;
  Point_<int> local_198;
  Point_<int> local_190;
  undefined1 local_188 [24];
  undefined1 local_170 [32];
  Point_<int> local_150;
  Point_<int> local_148;
  undefined1 local_140 [24];
  undefined1 local_128 [32];
  Point_<int> local_108;
  Point_<int> local_100;
  undefined1 local_f8 [24];
  undefined1 local_e0 [32];
  Point_<int> local_c0;
  Point_<int> local_b8;
  undefined1 local_b0 [28];
  int local_94;
  Point_<int> local_90;
  Point_<int> local_88;
  Point_<int> local_80;
  Point_<int> *local_78;
  int local_6c;
  byte local_65;
  Point_<int> local_58;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_50;
  const_reference local_38;
  _InputOutputArray *local_30;
  byte local_21;
  int local_20;
  int local_1c;
  vector<Object,_std::allocator<Object>_> *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  poVar1 = std::operator<<((ostream *)&std::cout,"----Left to right effect----");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_1c = *(int *)(local_10 + 0xc) / 3;
  local_20 = *(int *)(local_10 + 0xc) / 3 << 1;
  local_21 = 0;
  local_30 = (_InputOutputArray *)0x0;
  while (this_00 = local_30,
        p_Var2 = (_InputOutputArray *)std::vector<Object,_std::allocator<Object>_>::size(local_18),
        this_00 < p_Var2) {
    local_38 = std::vector<Object,_std::allocator<Object>_>::operator[]
                         (local_18,(size_type)local_30);
    poVar1 = std::operator<<((ostream *)&std::cout,"obj.prob ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_38->prob);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    if (0.5 <= local_38->prob) {
      local_21 = 1;
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)0x145e33);
      cv::Point_<int>::Point_(&local_58,local_1c,1);
      std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<cv::Point_<int>>
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)this_00,
                 in_stack_fffffffffffffe38);
      local_65 = 0;
      for (local_6c = 0; local_6c < *(int *)(local_10 + 8); local_6c = local_6c + 1) {
        in_stack_fffffffffffffe38 = (Point_<int> *)cv::Mat::ptr(&local_38->mask,local_6c);
        local_78 = in_stack_fffffffffffffe38;
        if ((*(uchar *)((long)&in_stack_fffffffffffffe38->x + (long)local_1c) == 0xff) &&
           ((local_65 & 1) == 0)) {
          local_65 = 1;
          cv::Point_<int>::Point_(&local_80,local_1c,local_6c);
          std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
          emplace_back<cv::Point_<int>>
                    ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)this_00,
                     in_stack_fffffffffffffe38);
        }
        else if ((*(uchar *)((long)&in_stack_fffffffffffffe38->x + (long)local_1c) == '\0') &&
                ((local_65 & 1) != 0)) {
          local_65 = 0;
          cv::Point_<int>::Point_(&local_88,local_1c,local_6c);
          std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
          emplace_back<cv::Point_<int>>
                    ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)this_00,
                     in_stack_fffffffffffffe38);
        }
      }
      cv::Point_<int>::Point_(&local_90,local_1c,*(int *)(local_10 + 8) + -1);
      std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<cv::Point_<int>>
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)this_00,
                 in_stack_fffffffffffffe38);
      local_94 = 0;
      while (in_stack_fffffffffffffe34 = local_94,
            sVar3 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size(&local_50)
            , in_stack_fffffffffffffe34 < (int)sVar3) {
        cv::_InputOutputArray::_InputOutputArray(this_00,(Mat *)in_stack_fffffffffffffe38);
        pvVar4 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                           (&local_50,(long)local_94);
        cv::Point_<int>::Point_(&local_b8,pvVar4);
        pvVar4 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                           (&local_50,(long)(local_94 + 1));
        cv::Point_<int>::Point_(&local_c0,pvVar4);
        cv::Scalar_<double>::Scalar_
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(double)this_00,
                   (double)in_stack_fffffffffffffe38,
                   (double)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        cv::line(local_b0,&local_b8,&local_c0,local_e0,4,0xffffffff,0);
        cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x1460f1);
        local_94 = local_94 + 2;
      }
      cv::_InputOutputArray::_InputOutputArray(this_00,(Mat *)in_stack_fffffffffffffe38);
      cv::Point_<int>::Point_(&local_100,local_20,1);
      cv::Point_<int>::Point_(&local_108,local_20,*(int *)(local_10 + 8) + -1);
      cv::Scalar_<double>::Scalar_
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(double)this_00,
                 (double)in_stack_fffffffffffffe38,
                 (double)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      cv::line(local_f8,&local_100,&local_108,local_128,4,0xffffffff,0);
      cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x1461eb);
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)this_00);
    }
    local_30 = (_InputOutputArray *)
               ((long)&(local_30->super__OutputArray).super__InputArray.flags + 1);
  }
  if ((local_21 & 1) == 0) {
    cv::_InputOutputArray::_InputOutputArray(this_00,(Mat *)in_stack_fffffffffffffe38);
    cv::Point_<int>::Point_(&local_148,local_1c,1);
    cv::Point_<int>::Point_(&local_150,local_1c,*(int *)(local_10 + 8) + -1);
    cv::Scalar_<double>::Scalar_
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(double)this_00,
               (double)in_stack_fffffffffffffe38,
               (double)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    cv::line(local_140,&local_148,&local_150,local_170,4,0xffffffff,0);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x146308);
    cv::_InputOutputArray::_InputOutputArray(this_00,(Mat *)in_stack_fffffffffffffe38);
    cv::Point_<int>::Point_(&local_190,local_20,1);
    cv::Point_<int>::Point_(&local_198,local_20,*(int *)(local_10 + 8) + -1);
    cv::Scalar_<double>::Scalar_
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(double)this_00,
               (double)in_stack_fffffffffffffe38,
               (double)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    cv::line(local_188,&local_190,&local_198,&stack0xfffffffffffffe48,4,0xffffffff,0);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x1463a9);
  }
  return 0;
}

Assistant:

int LREffect::draw(cv::Mat& image, const std::vector<Object>& objects) 
{
    std::cout << "----Left to right effect----" << std::endl;

    int left_x = image.cols/3;
    int right_x = image.cols/3*2;

    bool has_major_obj = false;

    for (size_t i = 0; i < objects.size(); i++)
    {
        const Object& obj = objects[i];
//            float ratio = obj.rect.area() / (image.rows * image.cols);
        std::cout << "obj.prob " << obj.prob << std::endl;

        if (obj.prob < 0.5 ) 
        {
            continue;
        }

        has_major_obj = true;
        // draw white line

        // left line
        std::vector<cv::Point> points;
        points.emplace_back(cv::Point(left_x, 1));
        bool is_mask = false;

        for (int y = 0; y < image.rows; y++)
        {
            const uchar* mp = obj.mask.ptr(y);
            if (mp[left_x] == 255 && !is_mask)
            {
                is_mask = true;
                points.emplace_back(cv::Point(left_x, y));
            }
            else if (mp[left_x] == 0 && is_mask)
            {
                is_mask = false;
                points.emplace_back(cv::Point(left_x, y));
            }
        }
        points.emplace_back(cv::Point(left_x, image.rows - 1));

        for (int j = 0; j < (int)points.size(); j += 2)
        {
            cv::line(image, points[j], points[j + 1], cv::Scalar(255, 255, 255), 4, -1);
        }

        // right line
        cv::line(image, cv::Point(right_x, 1), cv::Point(right_x, image.rows - 1), cv::Scalar(255,255,255), 4, -1);
    }

    if (!has_major_obj)
    {
        cv::line(image, cv::Point(left_x, 1), cv::Point(left_x, image.rows - 1),
                    cv::Scalar(255,255,255), 4, -1);
        cv::line(image, cv::Point(right_x, 1), cv::Point(right_x, image.rows - 1),
                    cv::Scalar(255,255,255), 4, -1);
    }
    return 0;
}